

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  wchar_t *__dest;
  undefined1 value [16];
  anon_class_40_4_2c7d0318 add_thousands_sep;
  wchar_t *pwVar1;
  size_t __n;
  int digit_index;
  const_iterator group;
  undefined4 in_stack_fffffffffffffe70;
  undefined8 local_160;
  wchar_t local_158 [78];
  
  local_160 = **(undefined8 **)(this + 0x18);
  __dest = *it;
  value._8_8_ = this + 0x20;
  value._0_8_ = this;
  add_thousands_sep.s.data_ = (wchar_t *)&local_160;
  add_thousands_sep.this = (num_writer *)0x1;
  add_thousands_sep.s.size_ = (size_t)&stack0xfffffffffffffe74;
  add_thousands_sep.group._0_4_ = in_stack_fffffffffffffe70;
  add_thousands_sep.group._4_4_ = 0;
  add_thousands_sep.digit_index = (int *)this;
  pwVar1 = internal::operator()
                     (local_158,(unsigned___int128)value,(int)*(undefined8 *)this,add_thousands_sep)
  ;
  __n = (long)pwVar1 - (long)local_158;
  if (__n != 0) {
    memcpy(__dest,local_158,__n);
  }
  *it = (wchar_t *)((long)__dest + __n);
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }